

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

void __thiscall
axl::sl::
OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>_>
::clear(OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>_>
        *this)

{
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *p;
  Delete<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_> local_19;
  
  p = (this->
      super_ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
      ).super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>.m_head;
  if (p != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    while (p != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
      pRVar1 = (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)
               (p->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_next;
      mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>::operator()
                (&local_19,p);
      p = pRVar1;
    }
    (this->
    super_ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>.m_head =
         (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0;
    (this->
    super_ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>.m_tail =
         (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0;
    (this->
    super_ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>.m_count = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}